

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_duplex.cpp
# Opt level: O0

void state_cb_duplex(cubeb_stream *stream,void *param_2,cubeb_state state)

{
  uint in_EDX;
  long in_RDI;
  
  if (in_RDI != 0) {
    if (in_EDX == 0) {
      fprintf(_stderr,"stream started\n");
    }
    else if (in_EDX == 1) {
      fprintf(_stderr,"stream stopped\n");
    }
    else if (in_EDX == 2) {
      fprintf(_stderr,"stream drained\n");
    }
    else {
      fprintf(_stderr,"unknown stream state %d\n",(ulong)in_EDX);
    }
  }
  return;
}

Assistant:

void state_cb_duplex(cubeb_stream * stream, void * /*user*/, cubeb_state state)
{
  if (stream == NULL)
    return;

  switch (state) {
  case CUBEB_STATE_STARTED:
    fprintf(stderr, "stream started\n"); break;
  case CUBEB_STATE_STOPPED:
    fprintf(stderr, "stream stopped\n"); break;
  case CUBEB_STATE_DRAINED:
    fprintf(stderr, "stream drained\n"); break;
  default:
    fprintf(stderr, "unknown stream state %d\n", state);
  }

  return;
}